

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

bc_slist_t * blogc_source_parse_from_files(bc_trie_t *conf,bc_slist_t *l,bc_error_t **err)

{
  _bc_slist_t *p_Var1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  bc_trie_t *pbVar6;
  char *pcVar7;
  bc_slist_t *pbVar8;
  size_t sVar9;
  bc_error_t *pbVar10;
  _bc_slist_t *p_Var11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  char **strv;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  code *cmp;
  char **ppcVar18;
  bc_slist_t *pbVar19;
  ulong uVar20;
  float fVar21;
  bc_error_t *tmp_err;
  char *endptr;
  bc_error_t *local_88;
  bc_slist_t *local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  char *local_60;
  long local_58;
  bc_slist_t *local_50;
  ulong local_48;
  ulong local_40;
  bc_slist_t *local_38;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    pbVar8 = (bc_slist_t *)0x0;
  }
  else {
    pcVar5 = (char *)bc_trie_lookup(conf,"FILTER_SORT");
    _Var2 = bc_str_to_bool(pcVar5);
    local_88 = (bc_error_t *)0x0;
    pbVar8 = (bc_slist_t *)0x0;
    if (l != (bc_slist_t *)0x0) {
      uVar16 = 0;
      local_80 = l;
      do {
        pcVar5 = (char *)l->data;
        pbVar6 = blogc_source_parse_from_file(conf,pcVar5,&local_88);
        if (pbVar6 == (bc_trie_t *)0x0) {
          pbVar10 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                        "An error occurred while parsing source file: %s\n\n%s",
                                        pcVar5,local_88->msg);
          *err = pbVar10;
          bc_error_free(local_88);
          goto LAB_0010391b;
        }
        pcVar7 = (char *)bc_trie_lookup(pbVar6,"DATE");
        uVar16 = (uVar16 + 1) - (ulong)(pcVar7 == (char *)0x0);
        if (_Var2) {
          if (pcVar7 == (char *)0x0) {
            pbVar10 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                          "\'FILTER_SORT\' requires that \'DATE\' variable is set for every source file: %s"
                                          ,pcVar5);
            *err = pbVar10;
          }
          else {
            pcVar7 = blogc_convert_datetime(pcVar7,"%s",&local_88);
            if (pcVar7 != (char *)0x0) {
              bc_trie_insert(pbVar6,"c",pcVar7);
              goto LAB_0010337b;
            }
            pbVar10 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                          "An error occurred while parsing \'DATE\' variable: %s\n\n%s"
                                          ,pcVar5,local_88->msg);
            *err = pbVar10;
            bc_error_free(local_88);
          }
          bc_trie_free(pbVar6);
          goto LAB_0010391b;
        }
LAB_0010337b:
        pbVar8 = bc_slist_append(pbVar8,pbVar6);
        l = l->next;
      } while (l != (_bc_slist_t *)0x0);
      if ((uVar16 != 0) && (sVar9 = bc_slist_length(local_80), uVar16 < sVar9)) {
        pbVar10 = bc_error_new_printf(BLOGC_ERROR_LOADER,
                                      "\'DATE\' variable provided for at least one source file, but not for all source files. It must be provided for all files."
                                     );
        *err = pbVar10;
LAB_0010391b:
        bc_slist_free_full(pbVar8,bc_trie_free);
        return (bc_slist_t *)0x0;
      }
    }
    pcVar5 = (char *)bc_trie_lookup(conf,"FILTER_REVERSE");
    _Var3 = bc_str_to_bool(pcVar5);
    if (_Var2) {
      cmp = sort_source;
      if (_Var3) {
        cmp = sort_source_reverse;
      }
      p_Var11 = bc_slist_sort(pbVar8,cmp);
    }
    else {
      p_Var11 = pbVar8;
      if (_Var3) {
        p_Var11 = (bc_slist_t *)0x0;
        for (p_Var1 = pbVar8; p_Var1 != (bc_slist_t *)0x0; p_Var1 = p_Var1->next) {
          p_Var11 = bc_slist_prepend(p_Var11,p_Var1->data);
        }
        bc_slist_free(pbVar8);
      }
    }
    pcVar7 = (char *)bc_trie_lookup(conf,"FILTER_TAG");
    pcVar12 = (char *)bc_trie_lookup(conf,"FILTER_PAGE");
    pcVar13 = (char *)bc_trie_lookup(conf,"FILTER_PER_PAGE");
    pcVar5 = "";
    if (pcVar12 != (char *)0x0) {
      pcVar5 = pcVar12;
    }
    local_80 = (bc_slist_t *)pcVar12;
    local_68 = strtol(pcVar5,&local_60,10);
    if ((*pcVar5 != '\0') && (*local_60 != '\0')) {
      fprintf(_stderr,"warning: invalid value for \'FILTER_PAGE\' variable: %s. using %ld instead\n"
              ,pcVar5,local_68);
    }
    uVar16 = 1;
    if (1 < (long)local_68) {
      uVar16 = local_68;
    }
    pcVar5 = "10";
    if (pcVar13 != (char *)0x0) {
      pcVar5 = pcVar13;
    }
    lVar14 = strtol(pcVar5,&local_60,10);
    if ((*pcVar5 != '\0') && (*local_60 != '\0')) {
      fprintf(_stderr,
              "warning: invalid value for \'FILTER_PER_PAGE\' variable: %s. using %ld instead\n",
              pcVar5,lVar14);
    }
    lVar17 = 0;
    if (0 < lVar14) {
      lVar17 = lVar14;
    }
    lVar14 = uVar16 - 1;
    if (p_Var11 == (bc_slist_t *)0x0) {
      bc_slist_free((bc_slist_t *)0x0);
      fVar21 = 0.0;
      pbVar8 = (bc_slist_t *)0x0;
    }
    else {
      local_40 = lVar17 * lVar14;
      local_48 = lVar17 * uVar16;
      pbVar8 = (bc_slist_t *)0x0;
      uVar20 = 0;
      local_78 = lVar17;
      local_70 = uVar16;
      local_58 = lVar14;
      local_50 = p_Var11;
      do {
        pbVar6 = (bc_trie_t *)p_Var11->data;
        if (pcVar7 == (char *)0x0) {
LAB_001035c7:
          uVar16 = uVar20;
          if ((local_80 == (bc_slist_t *)0x0) ||
             ((uVar16 = uVar20 + 1, local_40 <= uVar20 && (uVar20 < local_48)))) {
            pbVar8 = bc_slist_append(pbVar8,pbVar6);
            uVar20 = uVar16;
          }
          else {
            bc_trie_free(pbVar6);
            uVar20 = uVar16;
          }
        }
        else {
          pcVar5 = (char *)bc_trie_lookup(pbVar6,"TAGS");
          if (pcVar5 != (char *)0x0) {
            strv = bc_str_split(pcVar5,' ',0);
            pcVar5 = *strv;
            if (pcVar5 == (char *)0x0) {
              bc_strv_free(strv);
            }
            else {
              bVar15 = false;
              ppcVar18 = strv;
              local_38 = pbVar8;
              do {
                ppcVar18 = ppcVar18 + 1;
                if (*pcVar5 != '\0') {
                  iVar4 = strcmp(pcVar5,pcVar7);
                  bVar15 = (bool)(bVar15 | iVar4 == 0);
                }
                pcVar5 = *ppcVar18;
              } while (pcVar5 != (char *)0x0);
              bc_strv_free(strv);
              pbVar8 = local_38;
              if (bVar15) goto LAB_001035c7;
            }
          }
          bc_trie_free(pbVar6);
        }
        uVar16 = local_70;
        lVar17 = local_78;
        p_Var11 = p_Var11->next;
      } while (p_Var11 != (_bc_slist_t *)0x0);
      fVar21 = (float)uVar20;
      bc_slist_free(local_50);
      if (pbVar8 == (bc_slist_t *)0x0) {
        pbVar8 = (bc_slist_t *)0x0;
        lVar14 = local_58;
      }
      else {
        bVar15 = true;
        pbVar19 = pbVar8;
        do {
          pbVar6 = (bc_trie_t *)pbVar19->data;
          if (bVar15) {
            pcVar5 = (char *)bc_trie_lookup(pbVar6,"DATE");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = bc_strdup(pcVar5);
              bc_trie_insert(conf,"DATE_FIRST",pcVar5);
            }
            pcVar5 = (char *)bc_trie_lookup(pbVar6,"FILENAME");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = bc_strdup(pcVar5);
              bc_trie_insert(conf,"FILENAME_FIRST",pcVar5);
            }
          }
          p_Var11 = pbVar19->next;
          if (p_Var11 == (_bc_slist_t *)0x0) {
            pcVar5 = (char *)bc_trie_lookup(pbVar6,"DATE");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = bc_strdup(pcVar5);
              bc_trie_insert(conf,"DATE_LAST",pcVar5);
            }
            pcVar5 = (char *)bc_trie_lookup(pbVar6,"FILENAME");
            if (pcVar5 != (char *)0x0) {
              pcVar5 = bc_strdup(pcVar5);
              bc_trie_insert(conf,"FILENAME_LAST",pcVar5);
            }
            p_Var11 = pbVar19->next;
          }
          bVar15 = false;
          lVar17 = local_78;
          uVar16 = local_70;
          lVar14 = local_58;
          pbVar19 = p_Var11;
        } while (p_Var11 != (_bc_slist_t *)0x0);
      }
    }
    if (local_80 != (bc_slist_t *)0x0) {
      fVar21 = ceilf(fVar21 / (float)lVar17);
      uVar20 = (long)(fVar21 - 9.223372e+18) & (long)fVar21 >> 0x3f | (long)fVar21;
      pcVar5 = bc_strdup_printf("%ld",uVar16);
      bc_trie_insert(conf,"CURRENT_PAGE",pcVar5);
      if (1 < (long)local_68) {
        pcVar5 = bc_strdup_printf("%ld",lVar14);
        bc_trie_insert(conf,"PREVIOUS_PAGE",pcVar5);
      }
      if (uVar16 < uVar20) {
        pcVar5 = bc_strdup_printf("%ld",uVar16 + 1);
        bc_trie_insert(conf,"NEXT_PAGE",pcVar5);
      }
      sVar9 = bc_slist_length(pbVar8);
      if (sVar9 != 0) {
        pcVar5 = bc_strdup("1");
        bc_trie_insert(conf,"FIRST_PAGE",pcVar5);
      }
      if (uVar20 != 0) {
        pcVar5 = bc_strdup_printf("%d",uVar20);
        bc_trie_insert(conf,"LAST_PAGE",pcVar5);
      }
    }
  }
  return pbVar8;
}

Assistant:

bc_slist_t*
blogc_source_parse_from_files(bc_trie_t *conf, bc_slist_t *l, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    bool sort = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_SORT"));

    bc_slist_t* sources = NULL;
    bc_error_t *tmp_err = NULL;
    size_t with_date = 0;
    for (bc_slist_t *tmp = l; tmp != NULL; tmp = tmp->next) {
        char *f = tmp->data;
        bc_trie_t *s = blogc_source_parse_from_file(conf, f, &tmp_err);
        if (s == NULL) {
            *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                "An error occurred while parsing source file: %s\n\n%s",
                f, tmp_err->msg);
            bc_error_free(tmp_err);
            bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
            return NULL;
        }

        const char *date = bc_trie_lookup(s, "DATE");
        if (date != NULL) {
            with_date++;
        }

        if (sort) {
            if (date == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "'FILTER_SORT' requires that 'DATE' variable is set for "
                    "every source file: %s", f);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            char *timestamp = blogc_convert_datetime(date, "%s", &tmp_err);
            if (timestamp == NULL) {
                *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
                    "An error occurred while parsing 'DATE' variable: %s"
                    "\n\n%s", f, tmp_err->msg);
                bc_error_free(tmp_err);
                bc_trie_free(s);
                bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
                return NULL;
            }

            bc_trie_insert(s, "c", timestamp);
        }

        sources = bc_slist_append(sources, s);
    }

    if (with_date > 0 && with_date < bc_slist_length(l)) {
        *err = bc_error_new_printf(BLOGC_ERROR_LOADER,
            "'DATE' variable provided for at least one source file, but not "
            "for all source files. It must be provided for all files.");
        bc_slist_free_full(sources, (bc_free_func_t) bc_trie_free);
        return NULL;
    }

    bool reverse = bc_str_to_bool(bc_trie_lookup(conf, "FILTER_REVERSE"));

    if (sort) {
        sources = bc_slist_sort(sources,
            (bc_sort_func_t) (reverse ? sort_source_reverse : sort_source));
    }
    else if (reverse) {
        bc_slist_t *tmp_sources = NULL;
        for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
            tmp_sources = bc_slist_prepend(tmp_sources, tmp->data);
        }
        bc_slist_t *tmp = sources;
        sources = tmp_sources;
        bc_slist_free(tmp);
    }

    const char *filter_tag = bc_trie_lookup(conf, "FILTER_TAG");
    const char *filter_page = bc_trie_lookup(conf, "FILTER_PAGE");
    const char *filter_per_page = bc_trie_lookup(conf, "FILTER_PER_PAGE");

    const char *ptr;
    char *endptr;

    ptr = filter_page != NULL ? filter_page : "";
    long page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, page);
    if (page <= 0)
        page = 1;

    ptr = filter_per_page != NULL ? filter_per_page : "10";
    long per_page = strtol(ptr, &endptr, 10);
    if (*ptr != '\0' && *endptr != '\0')
        fprintf(stderr, "warning: invalid value for 'FILTER_PER_PAGE' variable: "
            "%s. using %ld instead\n", ptr, per_page);
    if (per_page < 0)
        per_page = 0;

    // poor man's pagination
    size_t start = (page - 1) * per_page;
    size_t end = start + per_page;
    size_t counter = 0;

    bc_slist_t *rv = NULL;
    for (bc_slist_t *tmp = sources; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (filter_tag != NULL) {
            const char *tags_str = bc_trie_lookup(s, "TAGS");
            // if user wants to filter by tag and no tag is provided, skip it
            if (tags_str == NULL) {
                bc_trie_free(s);
                continue;
            }
            char **tags = bc_str_split(tags_str, ' ', 0);
            bool found = false;
            for (size_t i = 0; tags[i] != NULL; i++) {
                if (tags[i][0] == '\0')
                    continue;
                if (0 == strcmp(tags[i], filter_tag))
                    found = true;
            }
            bc_strv_free(tags);
            if (!found) {
                bc_trie_free(s);
                continue;
            }
        }
        if (filter_page != NULL) {
            if (counter < start || counter >= end) {
                counter++;
                bc_trie_free(s);
                continue;
            }
            counter++;
        }
        rv = bc_slist_append(rv, s);
    }

    bc_slist_free(sources);

    bool first = true;
    for (bc_slist_t *tmp = rv; tmp != NULL; tmp = tmp->next) {
        bc_trie_t *s = tmp->data;
        if (first) {
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_FIRST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_FIRST", bc_strdup(val));
            first = false;
        }
        if (tmp->next == NULL) {  // last
            const char *val = bc_trie_lookup(s, "DATE");
            if (val != NULL)
                bc_trie_insert(conf, "DATE_LAST", bc_strdup(val));
            val = bc_trie_lookup(s, "FILENAME");
            if (val != NULL)
                bc_trie_insert(conf, "FILENAME_LAST", bc_strdup(val));
        }
    }

    if (filter_page != NULL) {
        size_t last_page = ceilf(((float) counter) / per_page);
        bc_trie_insert(conf, "CURRENT_PAGE", bc_strdup_printf("%ld", page));
        if (page > 1)
            bc_trie_insert(conf, "PREVIOUS_PAGE", bc_strdup_printf("%ld", page - 1));
        if (page < last_page)
            bc_trie_insert(conf, "NEXT_PAGE", bc_strdup_printf("%ld", page + 1));
        if (bc_slist_length(rv) > 0)
            bc_trie_insert(conf, "FIRST_PAGE", bc_strdup("1"));
        if (last_page > 0)
            bc_trie_insert(conf, "LAST_PAGE", bc_strdup_printf("%d", last_page));
    }

    return rv;
}